

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::post_piece_availability(torrent *this)

{
  int iVar1;
  undefined4 extraout_var;
  vector<int,_piece_index_t> avail;
  undefined1 auStack_38 [24];
  element_type *peStack_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  auStack_38._16_8_ =
       (__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
        )0x0;
  peStack_20 = (element_type *)0x0;
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piece_availability(this,(vector<int,_piece_index_t> *)(auStack_38 + 0x10));
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  get_handle((torrent *)auStack_38);
  alert_manager::
  emplace_alert<libtorrent::piece_availability_alert,libtorrent::torrent_handle,libtorrent::aux::container_wrapper<int,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<int,std::allocator<int>>>>
            ((alert_manager *)CONCAT44(extraout_var,iVar1),(torrent_handle *)auStack_38,
             (container_wrapper<int,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>
              *)(auStack_38 + 0x10));
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(auStack_38 + 0x10));
  return;
}

Assistant:

void torrent::post_piece_availability()
	{
		aux::vector<int, piece_index_t> avail;
		piece_availability(avail);
		alerts().emplace_alert<piece_availability_alert>(get_handle(), std::move(avail));
	}